

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

int If_CluSupportSize(word *t,int nVars)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  word *pwVar9;
  ulong uVar10;
  word *pwVar11;
  
  if (nVars < 1) {
    return 0;
  }
  uVar1 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar1 = 1;
  }
  uVar4 = 0;
  iVar2 = 0;
LAB_00414cd7:
  if (uVar4 < 6) {
    iVar7 = 0;
    if (0 < (int)uVar1) {
      uVar10 = 0;
      do {
        if ((t[uVar10] & ~Truth6[uVar4]) !=
            (t[uVar10] & Truth6[uVar4]) >> ((byte)(1 << ((byte)uVar4 & 0x1f)) & 0x3f))
        goto LAB_00414d84;
        uVar10 = uVar10 + 1;
        iVar7 = 0;
      } while (uVar1 != uVar10);
    }
  }
  else {
    if (0 < (int)uVar1) {
      bVar3 = (byte)(uVar4 - 6);
      uVar5 = 1 << (bVar3 & 0x1f);
      iVar7 = 2 << (bVar3 & 0x1f);
      uVar10 = 1;
      if (1 < (int)uVar5) {
        uVar10 = (ulong)uVar5;
      }
      pwVar9 = t + (int)uVar5;
      iVar6 = 0;
      pwVar11 = t;
      do {
        if (uVar4 - 6 != 0x1f) {
          uVar8 = 0;
          do {
            if (pwVar11[uVar8] != pwVar9[uVar8]) goto LAB_00414d84;
            uVar8 = uVar8 + 1;
          } while (uVar10 != uVar8);
        }
        iVar6 = iVar6 + iVar7;
        pwVar9 = pwVar9 + iVar7;
        pwVar11 = pwVar11 + iVar7;
      } while (iVar6 < (int)uVar1);
    }
    iVar7 = 0;
  }
  goto LAB_00414d8a;
LAB_00414d84:
  iVar7 = 1;
LAB_00414d8a:
  iVar2 = iVar2 + iVar7;
  uVar4 = uVar4 + 1;
  if (uVar4 == (uint)nVars) {
    return iVar2;
  }
  goto LAB_00414cd7;
}

Assistant:

int If_CluSupportSize( word * t, int nVars )
{
    int v, SuppSize = 0;
    for ( v = 0; v < nVars; v++ )
        if ( If_CluHasVar( t, nVars, v ) )
            SuppSize++;
    return SuppSize;
}